

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::anon_unknown_34::BrokenPipeline::getPipelinedCap
          (BrokenPipeline *this,ArrayPtr<const_capnp::PipelineOp> ops)

{
  uint *puVar1;
  BrokenClient *this_00;
  ClientHook *extraout_RDX;
  Own<capnp::ClientHook,_std::nullptr_t> OVar2;
  Own<capnp::(anonymous_namespace)::BrokenClient,_std::nullptr_t> local_28;
  
  this_00 = (BrokenClient *)operator_new(0x1b8);
  BrokenClient::BrokenClient
            (this_00,(Exception *)(ops.ptr + 3),false,&ClientHook::BROKEN_CAPABILITY_BRAND);
  puVar1 = &(this_00->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  local_28.disposer = &(this_00->super_Refcounted).super_Disposer;
  (this->super_PipelineHook)._vptr_PipelineHook = (_func_int **)local_28.disposer;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)this_00;
  local_28.ptr = (BrokenClient *)0x0;
  kj::Own<capnp::(anonymous_namespace)::BrokenClient,_std::nullptr_t>::~Own(&local_28);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

kj::Own<ClientHook> BrokenPipeline::getPipelinedCap(kj::ArrayPtr<const PipelineOp> ops) {
  return kj::refcounted<BrokenClient>(exception, false, &ClientHook::BROKEN_CAPABILITY_BRAND);
}